

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O3

void __thiscall
randomx::AssemblyGeneratorX86::genAddressRegDst
          (AssemblyGeneratorX86 *this,Instruction *instr,int maskAlign)

{
  undefined1 *this_00;
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  long *plVar3;
  uint uVar4;
  uint uVar5;
  
  this_00 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tlea eax, [",0xb);
  __s = *(char **)(regR32 + (ulong)instr->dst * 8);
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar1);
  *(uint *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x10 + -0x18)) =
       *(uint *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x10 + -0x18)) | 0x800;
  poVar2 = (ostream *)std::ostream::operator<<(this_00,instr->imm32);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffff7ff;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  uVar4 = 0x3ff8;
  if ((instr->mod & 3) == 0) {
    uVar4 = 0x3fff8;
  }
  uVar5 = 0x1ffff8;
  if (instr->mod < 0xe0) {
    uVar5 = uVar4;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tand eax",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  plVar3 = (long *)std::ostream::operator<<(this_00,-maskAlign & uVar5);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void AssemblyGeneratorX86::genAddressRegDst(Instruction& instr, int maskAlign = 8) {
		asmCode << "\tlea eax, [" << regR32[instr.dst] << std::showpos << (int32_t)instr.getImm32() << std::noshowpos << "]" << std::endl;
		int mask;
		if (instr.getModCond() < StoreL3Condition) {
			mask = instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask;
		}
		else {
			mask = ScratchpadL3Mask;
		}
		asmCode << "\tand eax" << ", " << (mask & (-maskAlign)) << std::endl;
	}